

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_adf.cc
# Opt level: O2

void CB_ADF::do_actual_learning<true>(cb_adf *data,multi_learner *base,multi_ex *ec_seq)

{
  bool bVar1;
  ostream *poVar2;
  vw_exception *this;
  cb_class cVar3;
  string local_1d0;
  stringstream __msg;
  ostream local_1a0;
  
  data->offset = ((*(ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                    super__Vector_impl_data._M_start)->super_example_predict).ft_offset;
  cVar3 = get_observed_cost(ec_seq);
  (data->gen_cs).known_cost = cVar3;
  bVar1 = test_adf_sequence(ec_seq);
  if (!bVar1) {
    switch((data->gen_cs).cb_type) {
    case 0:
      learn_DR(data,base,ec_seq);
      return;
    case 1:
      learn_DM(data,base,ec_seq);
      return;
    case 2:
      learn_IPS(data,base,ec_seq);
      return;
    case 3:
      goto switchD_0022dcad_caseD_3;
    default:
      std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
      poVar2 = std::operator<<(&local_1a0,
                               "Unknown cb_type specified for contextual bandit learning: ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      this = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (this,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/cb_adf.cc"
                 ,0xb1,&local_1d0);
      __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
  }
  GEN_CS::gen_cs_test_example(ec_seq,&data->cs_labels);
  GEN_CS::call_cs_ldf<false>
            (base,ec_seq,&data->cb_labels,&data->cs_labels,&data->prepped_cs_labels,data->offset,0);
  return;
switchD_0022dcad_caseD_3:
  if (data->no_predict != true) {
    learn_MTR<true>(data,base,ec_seq);
    return;
  }
  learn_MTR<false>(data,base,ec_seq);
  return;
}

Assistant:

void do_actual_learning(cb_adf& data, multi_learner& base, multi_ex& ec_seq)
{
  data.offset = ec_seq[0]->ft_offset;
  data.gen_cs.known_cost = get_observed_cost(ec_seq);  // need to set for test case
  if (is_learn && !test_adf_sequence(ec_seq))
  {
    /*	v_array<float> temp_scores;
    temp_scores = v_init<float>();
    do_actual_learning<false>(data,base);
    for (size_t i = 0; i < data.ec_seq[0]->pred.a_s.size(); i++)
    temp_scores.push_back(data.ec_seq[0]->pred.a_s[i].score);*/
    switch (data.gen_cs.cb_type)
    {
      case CB_TYPE_IPS:
        learn_IPS(data, base, ec_seq);
        break;
      case CB_TYPE_DR:
        learn_DR(data, base, ec_seq);
        break;
      case CB_TYPE_DM:
        learn_DM(data, base, ec_seq);
        break;
      case CB_TYPE_MTR:
        if (data.no_predict)
          learn_MTR<false>(data, base, ec_seq);
        else
          learn_MTR<true>(data, base, ec_seq);
        break;
      default:
        THROW("Unknown cb_type specified for contextual bandit learning: " << data.gen_cs.cb_type);
    }

    /*      for (size_t i = 0; i < temp_scores.size(); i++)
    if (temp_scores[i] != data.ec_seq[0]->pred.a_s[i].score)
      cout << "problem! " << temp_scores[i] << " != " << data.ec_seq[0]->pred.a_s[i].score << " for " <<
    data.ec_seq[0]->pred.a_s[i].action << endl; temp_scores.delete_v();*/
  }
  else
  {
    gen_cs_test_example(ec_seq, data.cs_labels);  // create test labels.
    call_cs_ldf<false>(base, ec_seq, data.cb_labels, data.cs_labels, data.prepped_cs_labels, data.offset);
  }
}